

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O1

void __thiscall OStreamTest_Print_Test::TestBody(OStreamTest_Print_Test *this)

{
  bool bVar1;
  undefined1 *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  basic_string_view<char> format_str;
  basic_string_view<wchar_t> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  AssertionResult gtest_ar_1;
  wostringstream wos;
  ostringstream os;
  AssertHelper local_b38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b30 [2];
  AssertHelper local_b20;
  char *local_b18;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b10 [13];
  ios_base local_aa8 [272];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_998;
  undefined1 local_978 [2000];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_b18 = "panic";
  local_998._M_string_length = (size_type)local_978;
  local_998.field_2._M_allocated_capacity = 0;
  local_998._M_dataplus._M_p = (pointer)&PTR_grow_001b1ec0;
  local_998.field_2._8_8_ = 500;
  format_str.size_ = 9;
  format_str.data_ = "Don\'t {}!";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_b18;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[6]>
                ::TYPES;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_998,format_str,args,(locale_ref)0x0);
  puVar2 = (undefined1 *)local_998._M_string_length;
  uVar4 = local_998.field_2._M_allocated_capacity;
  do {
    uVar5 = 0x7fffffffffffffff;
    if ((ulong)uVar4 < 0x7fffffffffffffff) {
      uVar5 = uVar4;
    }
    std::ostream::write((char *)local_1a8,(long)puVar2);
    puVar2 = puVar2 + uVar5;
    uVar4 = uVar4 - uVar5;
  } while (uVar4 != 0);
  local_998._M_dataplus._M_p = (pointer)&PTR_grow_001b1ec0;
  if ((undefined1 *)local_998._M_string_length != local_978) {
    operator_delete((void *)local_998._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)&local_b18,"\"Don\'t panic!\"","os.str()",(char (*) [13])"Don\'t panic!",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p);
  }
  if (local_b18._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_998);
    if (local_b10[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b10[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/ostream-test.cc"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b38,(Message *)&local_998);
    testing::internal::AssertHelper::~AssertHelper(&local_b38);
    if ((undefined **)local_998._M_dataplus._M_p != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_998._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_998._M_dataplus._M_p + 8))();
      }
      local_998._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_b10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&local_b18);
  local_b38.data_ = (AssertHelperData *)0x18ac60;
  local_998.field_2._M_allocated_capacity = 0;
  local_998._M_dataplus._M_p = (pointer)&PTR_grow_001b1d90;
  local_998._M_string_length = (size_type)local_978;
  local_998.field_2._8_8_ = 500;
  format_str_00.size_ = 9;
  format_str_00.data_ = L"Don\'t {}!";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)&local_b38;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t[6]>
       ::TYPES;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((range)&local_998,format_str_00,args_00,(locale_ref)0x0);
  puVar2 = (undefined1 *)local_998._M_string_length;
  uVar4 = local_998.field_2._M_allocated_capacity;
  do {
    uVar5 = 0x7fffffffffffffff;
    if ((ulong)uVar4 < 0x7fffffffffffffff) {
      uVar5 = uVar4;
    }
    std::wostream::write((wchar_t *)&local_b18,(long)puVar2);
    puVar2 = puVar2 + uVar5 * 4;
    uVar4 = uVar4 - uVar5;
  } while (uVar4 != 0);
  local_998._M_dataplus._M_p = (pointer)&PTR_grow_001b1d90;
  if ((undefined1 *)local_998._M_string_length != local_978) {
    operator_delete((void *)local_998._M_string_length);
  }
  std::__cxx11::wstringbuf::str();
  testing::internal::CmpHelperEQ<wchar_t[13],std::__cxx11::wstring>
            ((internal *)&local_b38,"L\"Don\'t panic!\"","wos.str()",
             (wchar_t (*) [13])L"Don\'t panic!",&local_998);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p);
  }
  if (local_b38.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_998);
    if (local_b30[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b30[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/ostream-test.cc"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b20,(Message *)&local_998);
    testing::internal::AssertHelper::~AssertHelper(&local_b20);
    if ((undefined **)local_998._M_dataplus._M_p != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_998._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_998._M_dataplus._M_p + 8))();
      }
      local_998._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_b30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&local_b18);
  std::ios_base::~ios_base(local_aa8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

TEST(OStreamTest, Print) {
  std::ostringstream os;
  fmt::print(os, "Don't {}!", "panic");
  EXPECT_EQ("Don't panic!", os.str());
  std::wostringstream wos;
  fmt::print(wos, L"Don't {}!", L"panic");
  EXPECT_EQ(L"Don't panic!", wos.str());
}